

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

void __thiscall wasm::ExecutionResults::check(ExecutionResults *this,Module *wasm)

{
  bool bVar1;
  undefined1 local_60 [8];
  ExecutionResults optimizedResults;
  
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&optimizedResults;
  optimizedResults.results._M_t._M_impl._0_4_ = 0;
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  optimizedResults.loggings.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  optimizedResults.loggings.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  optimizedResults.loggings.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       optimizedResults.results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  get((ExecutionResults *)local_60,wasm);
  bVar1 = operator!=((ExecutionResults *)local_60,this);
  if (!bVar1) {
    ~ExecutionResults((ExecutionResults *)local_60);
    return;
  }
  std::operator<<((ostream *)&std::cout,"[fuzz-exec] optimization passes changed results\n");
  exit(1);
}

Assistant:

void check(Module& wasm) {
    ExecutionResults optimizedResults;
    optimizedResults.get(wasm);
    if (optimizedResults != *this) {
      std::cout << "[fuzz-exec] optimization passes changed results\n";
      exit(1);
    }
  }